

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int ixxx::posix::nanosleep(timespec *__requested_time,timespec *__remaining)

{
  int iVar1;
  nanosleep_error *this;
  int *piVar2;
  
  iVar1 = ::nanosleep(__requested_time,__remaining);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (nanosleep_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  nanosleep_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&nanosleep_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void nanosleep(const struct timespec *req, struct timespec *rem)
    {
      int r = ::nanosleep(req, rem);
      if (r == -1)
        throw nanosleep_error(errno);
    }